

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O0

void __thiscall
pbrt::WavefrontPathIntegrator::UpdateDisplayRGBFromFilm
          (WavefrontPathIntegrator *this,Bounds2i pixelBounds)

{
  WavefrontPathIntegrator *this_local;
  Bounds2i pixelBounds_local;
  
  return;
}

Assistant:

void WavefrontPathIntegrator::UpdateDisplayRGBFromFilm(Bounds2i pixelBounds) {
#ifdef PBRT_BUILD_GPU_RENDERER
    Vector2i resolution = pixelBounds.Diagonal();
    GPUParallelFor(
        "Update Display RGB Buffer", resolution.x * resolution.y,
        PBRT_CPU_GPU_LAMBDA(int index) {
            Point2i p(index % resolution.x, index / resolution.x);
            displayRGB[index] = film.GetPixelRGB(p + pixelBounds.pMin);
        });
#endif  //  PBRT_BUILD_GPU_RENDERER
}